

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O2

void NULLCIO::GetMouseState(int *x,int *y)

{
  nullcThrowError("GetMouseState: supported only under Windows");
  return;
}

Assistant:

void GetMouseState(int* x, int* y)
	{
#if defined(_MSC_VER)
		if(!x)
		{
			nullcThrowError("ERROR: 'x' argument should not be a nullptr");
			return;
		}
		if(!y)
		{
			nullcThrowError("ERROR: 'y' argument should not be a nullptr");
			return;
		}

		POINT pos;
		GetCursorPos(&pos);
		*x = pos.x;
		*y = pos.y;
#elif defined(EMSCRIPTEN)
		SDL_GetMouseState(x, y);
#else
		(void)x;
		(void)y;

		nullcThrowError("GetMouseState: supported only under Windows");
#endif
	}